

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnShow(XL *out)

{
  XLearn *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  XLearn::GetHyperParam(this);
  uVar1 = std::__cxx11::string::c_str();
  XLearn::GetHyperParam(this);
  uVar2 = std::__cxx11::string::c_str();
  printf("Info: \n Model: %s\n Loss: %s\n",uVar1,uVar2);
  return 0;
}

Assistant:

XL_DLL int XLearnShow(XL *out) {
  API_BEGIN()
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  printf("Info: \n Model: %s\n Loss: %s\n", 
    xl->GetHyperParam().score_func.c_str(),
    xl->GetHyperParam().loss_func.c_str());
  API_END()
}